

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O0

void __thiscall CLI::AsSizeValue::AsSizeValue(AsSizeValue *this,bool kb_is_1000)

{
  bool in_DL;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_69;
  string local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_48;
  byte local_11;
  AsSizeValue *pAStack_10;
  bool kb_is_1000_local;
  AsSizeValue *this_local;
  
  local_11 = kb_is_1000;
  pAStack_10 = this;
  get_mapping_abi_cxx11_(&local_48,(AsSizeValue *)(ulong)(kb_is_1000 & 1),in_DL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"UNIT",&local_69);
  AsNumberWithUnit::AsNumberWithUnit<unsigned_long>
            (&this->super_AsNumberWithUnit,&local_48,CASE_INSENSITIVE,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  _GLOBAL__N_1::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map(&local_48);
  if ((local_11 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"SIZE [b, kb(=1024b), ...]",&local_c9);
    Validator::description((Validator *)this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a0,"SIZE [b, kb(=1000b), kib(=1024b), ...]",&local_a1);
    Validator::description((Validator *)this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return;
}

Assistant:

CLI11_INLINE AsSizeValue::AsSizeValue(bool kb_is_1000) : AsNumberWithUnit(get_mapping(kb_is_1000)) {
    if(kb_is_1000) {
        description("SIZE [b, kb(=1000b), kib(=1024b), ...]");
    } else {
        description("SIZE [b, kb(=1024b), ...]");
    }
}